

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O2

void test_dt_float(void)

{
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  char *pcVar1;
  char cVar2;
  bool bVar3;
  XSValue_Data *pXVar4;
  XSValue *pXVar5;
  char *pcVar6;
  wchar16 *pwVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  Status myStatus;
  StrX local_460;
  Status myStatus_22;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_iv_2 [8];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char lex_v_ran_iv_1_canrep [4];
  char data_canrep_4 [6];
  char lex_v_ran_iv_4 [17];
  char lex_v_ran_iv_3 [17];
  char lex_v_ran_iv_2 [17];
  char lex_v_ran_iv_1 [17];
  char data_rawstr_2 [8];
  char data_rawstr_5 [11];
  char data_rawstr_4 [11];
  char data_canrep_5 [9];
  char data_canrep_2 [9];
  char data_canrep_3 [10];
  char data_canrep_1 [10];
  char data_rawstr_3 [14];
  char lex_v_ran_v_4 [17];
  char lex_v_ran_v_3 [17];
  char lex_v_ran_v_2 [17];
  char lex_v_ran_v_1 [17];
  char lex_v_ran_v_0 [15];
  char data_rawstr_1 [16];
  undefined8 local_288;
  undefined8 local_260;
  ulong local_238;
  undefined8 local_210;
  undefined8 local_1e8;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined8 local_1c0;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined8 local_198;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 local_170;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined8 local_148;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_bc;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  int iVar11;
  
  builtin_strncpy(lex_v_ran_v_0,"  1234.e+10  \n",0xf);
  builtin_strncpy(lex_v_ran_v_1,"+3.402823466e+38",0x11);
  builtin_strncpy(lex_v_ran_v_2,"-3.402823466e+38",0x11);
  builtin_strncpy(lex_v_ran_v_3,"+1.175494351e-38",0x11);
  builtin_strncpy(lex_v_ran_v_4,"-1.175494351e-38",0x11);
  builtin_strncpy(lex_v_ran_iv_1,"+3.402823466e+39",0x11);
  builtin_strncpy(lex_v_ran_iv_2,"-3.402823466e+39",0x11);
  builtin_strncpy(lex_v_ran_iv_3,"+1.175494351e-46",0x11);
  builtin_strncpy(lex_v_ran_iv_4,"-1.175494351e-46",0x11);
  builtin_strncpy(lex_v_ran_iv_1_canrep,"INF",4);
  builtin_strncpy(lex_v_ran_iv_2_canrep,"-INF",5);
  lex_v_ran_iv_3_canrep[0] = '0';
  lex_v_ran_iv_3_canrep[1] = '\0';
  lex_v_ran_iv_4_canrep[0] = '0';
  lex_v_ran_iv_4_canrep[1] = '\0';
  builtin_strncpy(lex_iv_1,"12x.e+10",9);
  builtin_strncpy(lex_iv_2,"12.e+1x",8);
  builtin_strncpy(data_rawstr_1,"   -123.45    \n",0x10);
  builtin_strncpy(data_canrep_1,"-1.2345E2",10);
  builtin_strncpy(data_rawstr_2,"+123.45",8);
  builtin_strncpy(data_canrep_2,"1.2345E2",9);
  builtin_strncpy(data_rawstr_3 + 8,"+0012",6);
  builtin_strncpy(data_rawstr_3,"+123.45e",8);
  builtin_strncpy(data_canrep_3,"1.2345E14",10);
  builtin_strncpy(data_rawstr_4,"+100.000e2",0xb);
  builtin_strncpy(data_canrep_4,"1.0E4",6);
  builtin_strncpy(data_rawstr_5,"00100.23e2",0xb);
  builtin_strncpy(data_canrep_5,"1.0023E4",9);
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_v_0);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ea,lex_v_ran_v_0,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_v_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3eb,lex_v_ran_v_1,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_v_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ec,lex_v_ran_v_2,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_v_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ed,lex_v_ran_v_3,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_v_4);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ee,lex_v_ran_v_4,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f1,lex_v_ran_iv_1,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f2,lex_v_ran_iv_2,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_iv_3);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f3,lex_v_ran_iv_3,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_v_ran_iv_4);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f4,lex_v_ran_iv_4,local_460.fLocalForm,1);
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_iv_1);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    if (myStatus != st_FOCA0002) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pcVar1 = local_460.fLocalForm;
      pcVar6 = getStatusString(myStatus);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x3f7,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
      goto LAB_00105b7f;
    }
  }
  else {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f7,lex_iv_1,local_460.fLocalForm,0);
LAB_00105b7f:
    StrX::~StrX(&local_460);
    errSeen = 1;
  }
  _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
  StrX::StrX(&local_460,lex_iv_2);
  cVar2 = xercesc_4_0::XSValue::validate
                    (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_460);
  if (cVar2 == '\0') {
    if (myStatus == st_FOCA0002) goto LAB_00105c5c;
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    pcVar1 = local_460.fLocalForm;
    pcVar6 = getStatusString(myStatus);
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x3f8,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
  }
  else {
    StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f8,lex_iv_2,local_460.fLocalForm,0);
  }
  StrX::~StrX(&local_460);
  errSeen = 1;
LAB_00105c5c:
  iVar11 = 2;
  while (iVar10 = iVar11 + -1, iVar11 != 0) {
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_v_0);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x416,lex_v_ran_v_0);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      uStack_13c = (undefined4)local_4c;
      uStack_138 = (undefined4)((ulong)local_4c >> 0x20);
      expValue.fValue.f_datetime.f_month = uStack_13c;
      expValue.fValue.f_int = 0x55339215;
      expValue.fValue.f_datetime.f_hour = uStack_44;
      expValue.fValue.f_datetime.f_day = uStack_138;
      expValue.fValue.f_datetime.f_second = uStack_3c;
      expValue.fValue.f_datetime.f_min = uStack_40;
      expValue._0_8_ = local_148;
      expValue.fValue.f_datetime.f_milisec = (double)uStack_38;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_v_1);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x417,lex_v_ran_v_1);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      uStack_164 = (undefined4)local_68;
      uStack_160 = (undefined4)((ulong)local_68 >> 0x20);
      expValue_00.fValue.f_datetime.f_month = uStack_164;
      expValue_00.fValue.f_int = 0x7f7fffff;
      expValue_00.fValue.f_datetime.f_hour = uStack_60;
      expValue_00.fValue.f_datetime.f_day = uStack_160;
      expValue_00.fValue.f_datetime.f_second = uStack_58;
      expValue_00.fValue.f_datetime.f_min = uStack_5c;
      expValue_00._0_8_ = local_170;
      expValue_00.fValue.f_datetime.f_milisec = (double)uStack_54;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_00);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_v_2);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x418,lex_v_ran_v_2);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      uStack_18c = (undefined4)local_84;
      uStack_188 = (undefined4)((ulong)local_84 >> 0x20);
      expValue_01.fValue.f_datetime.f_month = uStack_18c;
      expValue_01.fValue.f_int = 0xff7fffff;
      expValue_01.fValue.f_datetime.f_hour = uStack_7c;
      expValue_01.fValue.f_datetime.f_day = uStack_188;
      expValue_01.fValue.f_datetime.f_second = uStack_74;
      expValue_01.fValue.f_datetime.f_min = uStack_78;
      expValue_01._0_8_ = local_198;
      expValue_01.fValue.f_datetime.f_milisec = (double)uStack_70;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_01);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_v_3);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x419,lex_v_ran_v_3);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      uStack_1b4 = (undefined4)local_a0;
      uStack_1b0 = (undefined4)((ulong)local_a0 >> 0x20);
      expValue_02.fValue.f_datetime.f_month = uStack_1b4;
      expValue_02.fValue.f_int = 0x800000;
      expValue_02.fValue.f_datetime.f_hour = uStack_98;
      expValue_02.fValue.f_datetime.f_day = uStack_1b0;
      expValue_02.fValue.f_datetime.f_second = uStack_90;
      expValue_02.fValue.f_datetime.f_min = uStack_94;
      expValue_02._0_8_ = local_1c0;
      expValue_02.fValue.f_datetime.f_milisec = (double)uStack_8c;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_02);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_v_4);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41a,lex_v_ran_v_4);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      uStack_1dc = (undefined4)local_bc;
      uStack_1d8 = (undefined4)((ulong)local_bc >> 0x20);
      expValue_03.fValue.f_datetime.f_month = uStack_1dc;
      expValue_03.fValue.f_float = -1.1754944e-38;
      expValue_03.fValue.f_datetime.f_hour = uStack_b4;
      expValue_03.fValue.f_datetime.f_day = uStack_1d8;
      expValue_03.fValue.f_datetime.f_second = uStack_ac;
      expValue_03.fValue.f_datetime.f_min = uStack_b0;
      expValue_03._0_8_ = local_1e8;
      expValue_03.fValue.f_datetime.f_milisec = (double)uStack_a8;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_03);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_iv_1);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41d,lex_v_ran_iv_1);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      expValue_04.fValue.f_long = 0x100000000;
      expValue_04._0_8_ = local_210;
      expValue_04.fValue._8_8_ = local_d8;
      expValue_04.fValue._16_8_ = uStack_d0;
      expValue_04.fValue.f_datetime.f_milisec = (double)local_c8;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_04);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_iv_2);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41e,lex_v_ran_iv_2);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      expValue_05.fValue.f_long = 0;
      expValue_05._0_8_ = local_238;
      expValue_05.fValue._8_8_ = local_f0;
      expValue_05.fValue._16_8_ = uStack_e8;
      expValue_05.fValue.f_datetime.f_milisec = (double)local_e0;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_05);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_iv_3);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41f,lex_v_ran_iv_3);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      expValue_06.fValue.f_long = 0x300000000;
      expValue_06._0_8_ = local_260;
      expValue_06.fValue._8_8_ = local_108;
      expValue_06.fValue._16_8_ = uStack_100;
      expValue_06.fValue.f_datetime.f_milisec = (double)local_f8;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_06);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_v_ran_iv_4);
    pvVar9 = (void *)0x3;
    pXVar4 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar4 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x420,lex_v_ran_iv_4);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      expValue_07.fValue.f_long = 0x300000000;
      expValue_07._0_8_ = local_288;
      expValue_07.fValue._8_8_ = local_120;
      expValue_07.fValue._16_8_ = uStack_118;
      expValue_07.fValue.f_datetime.f_milisec = (double)local_110;
      bVar3 = compareActualValue(dt_float,*pXVar4,expValue_07);
      if (!bVar3) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_iv_1);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar1 = local_460.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x423,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar9 = (void *)0x423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x423,lex_iv_1);
      StrX::~StrX(&local_460);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_iv_2);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    iVar11 = iVar10;
    if (pXVar5 == (XSValue *)0x0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar1 = local_460.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x424,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar9 = (void *)0x424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x424,lex_iv_2);
      StrX::~StrX(&local_460);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar9);
    }
  }
  iVar11 = 2;
  do {
    if (iVar11 == 0) {
      return;
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,data_rawstr_1);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x444,data_rawstr_1);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_1);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x444,data_rawstr_1,local_460.fLocalForm,_myStatus,data_canrep_1);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,data_rawstr_2);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x445,data_rawstr_2);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_2);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x445,data_rawstr_2,local_460.fLocalForm,_myStatus,data_canrep_2);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,data_rawstr_3);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x446,data_rawstr_3);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_3);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x446,data_rawstr_3,local_460.fLocalForm,_myStatus,data_canrep_3);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,data_rawstr_4);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x447,data_rawstr_4);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_4);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x447,data_rawstr_4,local_460.fLocalForm,_myStatus,data_canrep_4);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,data_rawstr_5);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x448,data_rawstr_5);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,data_canrep_5);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x448,data_rawstr_5,local_460.fLocalForm,_myStatus,data_canrep_5);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_iv_1);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (lVar8 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar1 = local_460.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,1099,lex_iv_1,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_460);
        goto LAB_00106f45;
      }
    }
    else {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,1099,lex_iv_1);
      StrX::~StrX(&local_460);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00106f45:
      errSeen = 1;
    }
    _myStatus = (char *)((ulong)_myStatus & 0xffffffff00000000);
    StrX::StrX(&local_460,lex_iv_2);
    lVar8 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_460.fUnicodeForm,dt_float,&myStatus,ver_10,iVar11 == 2,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (lVar8 == 0) {
      if (myStatus != st_FOCA0002) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar1 = local_460.fLocalForm;
        pcVar6 = getStatusString(myStatus);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x44c,lex_iv_2,pcVar1,"st_FOCA0002",pcVar6);
        StrX::~StrX(&local_460);
        goto LAB_00107026;
      }
    }
    else {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44c,lex_iv_2);
      StrX::~StrX(&local_460);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar8);
LAB_00107026:
      errSeen = 1;
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,lex_v_ran_iv_1);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44f,lex_v_ran_iv_1);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_1_canrep);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x44f,lex_v_ran_iv_1,local_460.fLocalForm,_myStatus,lex_v_ran_iv_1_canrep);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,lex_v_ran_iv_2);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x450,lex_v_ran_iv_2);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_2_canrep);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x450,lex_v_ran_iv_2,local_460.fLocalForm,_myStatus,lex_v_ran_iv_2_canrep);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,lex_v_ran_iv_3);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x451,lex_v_ran_iv_3);
      StrX::~StrX(&local_460);
      errSeen = 1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_3_canrep);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x451,lex_v_ran_iv_3,local_460.fLocalForm,_myStatus,lex_v_ran_iv_3_canrep);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    myStatus_22 = st_Init;
    StrX::StrX(&local_460,lex_v_ran_iv_4);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_460.fUnicodeForm,dt_float,&myStatus_22,ver_10,iVar11 == 2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_460);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x452,lex_v_ran_iv_4);
      StrX::~StrX(&local_460);
      errSeen = 1;
      iVar11 = iVar11 + -1;
    }
    else {
      _myStatus = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar3 = xercesc_4_0::XMLString::equals(_myStatus,lex_v_ran_iv_4_canrep);
      if (!bVar3) {
        StrX::StrX(&local_460,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x452,lex_v_ran_iv_4,local_460.fLocalForm,_myStatus,lex_v_ran_iv_4_canrep);
        StrX::~StrX(&local_460);
        errSeen = 1;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&myStatus,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      iVar11 = iVar11 + -1;
    }
  } while( true );
}

Assistant:

void test_dt_float()
{

    const XSValue::DataType dt = XSValue::dt_float;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="  1234.e+10  \n";
    const char lex_v_ran_v_1[]="+3.402823466e+38";
    const char lex_v_ran_v_2[]="-3.402823466e+38";
    const char lex_v_ran_v_3[]="+1.175494351e-38";
    const char lex_v_ran_v_4[]="-1.175494351e-38";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_float = (float)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_float = (float)+3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_float = (float)-3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_float = (float)+1.175494351e-38;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_float = (float)-1.175494351e-38;

    const char lex_v_ran_iv_1[]="+3.402823466e+39";
    const char lex_v_ran_iv_2[]="-3.402823466e+39";
    const char lex_v_ran_iv_3[]="+1.175494351e-46";
    const char lex_v_ran_iv_4[]="-1.175494351e-46";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_float = (float)0.0;
    lex_iv_ran_v_1.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_float = (float)0.0;
    lex_iv_ran_v_2.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_float = (float)0.0;
    lex_iv_ran_v_3.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_float = (float)0.0;
    lex_iv_ran_v_4.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 3.402823466E39"
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-3.402823466E39";
    const char lex_v_ran_iv_3_canrep[]="0";    // " 1.175494351E-46";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-1.175494351E-46";

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.4.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.4.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="   -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

        // lexical valid, range invalid (however XML4C ignores that)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}